

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu34x.c
# Opt level: O0

MPP_RET set_registers(H264dHalCtx_t *p_hal,Vdpu34xH264dRegSet *regs,HalTaskInfo *task)

{
  long lVar1;
  MppFrameFormat MVar2;
  int iVar3;
  RK_U32 RVar4;
  byte bVar5;
  uint local_cc;
  Vdpu34xH264dRegCtx *reg_ctx;
  MppBuffer mbuffer_2;
  uint local_90;
  RK_U32 bot_used;
  RK_U32 top_used;
  RK_U32 field_flag;
  MppFrame mframe_1;
  MppBuffer pvStack_78;
  RK_U32 min_frame_num;
  MppBuffer mbuffer_1;
  RK_S32 near_index;
  RK_S32 ref_index;
  RK_S32 i;
  RK_S32 fd;
  MppBuffer mbuffer;
  RK_U32 local_50;
  RK_U32 fbd_offset;
  RK_U32 fbc_hdr_stride;
  RK_U32 y_virstride;
  RK_U32 ver_virstride;
  RK_U32 hor_virstride;
  MppFrame mframe;
  HalBuf *mv_buf;
  Vdpu34xRegCommon *common;
  DXVA_PicParams_H264_MVC *pp;
  HalTaskInfo *task_local;
  Vdpu34xH264dRegSet *regs_local;
  H264dHalCtx_t *p_hal_local;
  
  common = (Vdpu34xRegCommon *)p_hal->pp;
  mframe = (MppFrame)0x0;
  mv_buf = (HalBuf *)regs;
  pp = (DXVA_PicParams_H264_MVC *)task;
  task_local = (HalTaskInfo *)regs;
  regs_local = (Vdpu34xH264dRegSet *)p_hal;
  memset(&regs->h264d_highpoc,0,0x14);
  mv_buf[2].cnt = (RK_U32)(regs_local->common).reg022;
  *(uint *)&mv_buf[1].field_0x4 =
       *(uint *)&mv_buf[1].field_0x4 & 0xfeffffff |
       (*(uint *)(*(long *)&(regs_local->common).reg018 + 0x84) & 1) << 0x18;
  mv_buf[1].cnt =
       mv_buf[1].cnt & 0xfffffffd |
       (uint)((*(ushort *)&(common->reg009).field_0x2 >> 0xc & 1) != 0) << 1;
  mv_buf[5].cnt = mv_buf[5].cnt & 0xfffff7ff;
  _ver_virstride = (MppFrame)0x0;
  y_virstride = 0;
  fbc_hdr_stride = 0;
  fbd_offset = 0;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)&(regs_local->common).reg028,(uint)(*(byte *)&common->reg009 & 0x7f),
             SLOT_FRAME_PTR,&ver_virstride);
  y_virstride = mpp_frame_get_hor_stride(_ver_virstride);
  fbc_hdr_stride = mpp_frame_get_ver_stride(_ver_virstride);
  fbd_offset = y_virstride * fbc_hdr_stride;
  MVar2 = mpp_frame_get_fmt(_ver_virstride);
  if ((MVar2 & 0xf00000) == MPP_FMT_YUV420SP) {
    mv_buf[1].cnt = mv_buf[1].cnt & 0xfffffffb;
    *(uint *)&mv_buf[2].buf = *(uint *)&mv_buf[2].buf & 0xffff0000 | y_virstride >> 4 & 0xffff;
    *(uint *)((long)&mv_buf[2].buf + 4) =
         *(uint *)((long)&mv_buf[2].buf + 4) & 0xffff0000 | y_virstride >> 4 & 0xffff;
    mv_buf[3].cnt = mv_buf[3].cnt & 0xf0000000 | fbd_offset >> 4;
  }
  else {
    local_50 = mpp_frame_get_fbc_hdr_stride(_ver_virstride);
    mbuffer._4_4_ = (local_50 * (fbc_hdr_stride + 0x10) >> 4) + 0xfff & 0xfffff000;
    mv_buf[1].cnt = mv_buf[1].cnt & 0xfffffffb | 4;
    *(uint *)&mv_buf[2].buf = *(uint *)&mv_buf[2].buf & 0xffff0000 | local_50 >> 4 & 0xffff;
    *(uint *)((long)&mv_buf[2].buf + 4) =
         *(uint *)((long)&mv_buf[2].buf + 4) & 0xffff0000 | local_50 >> 4 & 0xffff;
    mv_buf[3].cnt = mv_buf[3].cnt & 0xf | mbuffer._4_4_;
  }
  _i = (MppBuffer)0x0;
  ref_index = -1;
  (task_local->dec).refer[0xc] = common->reg016_str_len;
  *(SWREG17_SLICE_NUMBER *)((task_local->dec).refer + 0xd) = common->reg017;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)&(regs_local->common).reg028,(uint)(*(byte *)&common->reg009 & 0x7f),
             SLOT_BUFFER,&i);
  ref_index = mpp_buffer_get_fd_with_caller(_i,"set_registers");
  *(RK_S32 *)((long)task_local + 0x130) = ref_index;
  mframe = hal_bufs_get_buf(*(HalBufs *)(regs_local->h264d_param).reg67_98_ref_poc,
                            (uint)(*(byte *)&common->reg009 & 0x7f));
  iVar3 = mpp_buffer_get_fd_with_caller(*((HalBuf *)mframe)->buf,"set_registers");
  *(int *)((long)task_local + 0x134) = iVar3;
  *(RK_S32 *)((long)task_local + 0x138) = ref_index;
  if ((*(ushort *)&(common->reg009).field_0x2 & 1) == 0) {
    *(uint *)((long)task_local + 0x20c) = *(uint *)((long)task_local + 0x20c) & 0xfffffff0;
  }
  else {
    *(uint *)((long)task_local + 0x20c) =
         *(uint *)((long)task_local + 0x20c) & 0xfffffff0 | (uint)(*(byte *)&common->reg009 >> 7);
  }
  mbuffer_1._4_4_ = 0xffffffff;
  mbuffer_1._0_4_ = 0xffffffff;
  pvStack_78 = (MppBuffer)0x0;
  mframe_1._4_4_ = 0;
  _top_used = (MppFrame)0x0;
  for (near_index = 0; near_index < 0x10; near_index = near_index + 1) {
    bVar5 = (byte)near_index;
    bot_used = (int)(uint)*(ushort *)&common[0x18].field_12 >> (bVar5 & 0x1f) & 1;
    local_90 = (uint)common[2].reg018 >> ((byte)(near_index << 1) & 0x1f) & 1;
    mbuffer_2._4_4_ = (uint)common[2].reg018 >> ((char)(near_index << 1) + 1U & 0x1f) & 1;
    *(SWREG18_Y_HOR_STRIDE *)((long)task_local + (long)(near_index << 1) * 4 + 0x70) =
         (&common->reg018)[(long)near_index * 2];
    *(SWREG19_UV_HOR_STRIDE *)((long)task_local + (long)(near_index * 2 + 1) * 4 + 0x70) =
         (&common->reg019)[(long)near_index * 2];
    switch(near_index) {
    case 0:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffffffe | bot_used;
      break;
    case 1:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffffeff | bot_used << 8;
      break;
    case 2:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffeffff | bot_used << 0x10;
      break;
    case 3:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfeffffff | bot_used << 0x18;
      break;
    case 4:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffffffe | bot_used;
      break;
    case 5:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffffeff | bot_used << 8;
      break;
    case 6:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffeffff | bot_used << 0x10;
      break;
    case 7:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfeffffff | bot_used << 0x18;
      break;
    case 8:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffffffe | bot_used;
      break;
    case 9:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffffeff | bot_used << 8;
      break;
    case 10:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffeffff | bot_used << 0x10;
      break;
    case 0xb:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfeffffff | bot_used << 0x18;
      break;
    case 0xc:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffffffe | bot_used;
      break;
    case 0xd:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffffeff | bot_used << 8;
      break;
    case 0xe:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffeffff | bot_used << 0x10;
      break;
    case 0xf:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfeffffff | bot_used << 0x18;
    }
    switch(near_index) {
    case 0:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffffffd | local_90 << 1;
      break;
    case 1:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffffdff | local_90 << 9;
      break;
    case 2:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffdffff | local_90 << 0x11;
      break;
    case 3:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfdffffff | local_90 << 0x19;
      break;
    case 4:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffffffd | local_90 << 1;
      break;
    case 5:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffffdff | local_90 << 9;
      break;
    case 6:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffdffff | local_90 << 0x11;
      break;
    case 7:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfdffffff | local_90 << 0x19;
      break;
    case 8:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffffffd | local_90 << 1;
      break;
    case 9:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffffdff | local_90 << 9;
      break;
    case 10:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffdffff | local_90 << 0x11;
      break;
    case 0xb:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfdffffff | local_90 << 0x19;
      break;
    case 0xc:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffffffd | local_90 << 1;
      break;
    case 0xd:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffffdff | local_90 << 9;
      break;
    case 0xe:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffdffff | local_90 << 0x11;
      break;
    case 0xf:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfdffffff | local_90 << 0x19;
    }
    switch(near_index) {
    case 0:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffffffb | mbuffer_2._4_4_ << 2;
      break;
    case 1:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffffbff | mbuffer_2._4_4_ << 10;
      break;
    case 2:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffbffff | mbuffer_2._4_4_ << 0x12;
      break;
    case 3:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfbffffff | mbuffer_2._4_4_ << 0x1a;
      break;
    case 4:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffffffb | mbuffer_2._4_4_ << 2;
      break;
    case 5:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffffbff | mbuffer_2._4_4_ << 10;
      break;
    case 6:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffbffff | mbuffer_2._4_4_ << 0x12;
      break;
    case 7:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfbffffff | mbuffer_2._4_4_ << 0x1a;
      break;
    case 8:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffffffb | mbuffer_2._4_4_ << 2;
      break;
    case 9:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffffbff | mbuffer_2._4_4_ << 10;
      break;
    case 10:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffbffff | mbuffer_2._4_4_ << 0x12;
      break;
    case 0xb:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfbffffff | mbuffer_2._4_4_ << 0x1a;
      break;
    case 0xc:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffffffb | mbuffer_2._4_4_ << 2;
      break;
    case 0xd:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffffbff | mbuffer_2._4_4_ << 10;
      break;
    case 0xe:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffbffff | mbuffer_2._4_4_ << 0x12;
      break;
    case 0xf:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfbffffff | mbuffer_2._4_4_ << 0x1a;
    }
    switch(near_index) {
    case 0:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffffff7 |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 3;
      break;
    case 1:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfffff7ff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0xb;
      break;
    case 2:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xfff7ffff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0x13;
      break;
    case 3:
      *(uint *)((long)task_local + 0xf0) =
           *(uint *)((long)task_local + 0xf0) & 0xf7ffffff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0x1b;
      break;
    case 4:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffffff7 |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 3;
      break;
    case 5:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfffff7ff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0xb;
      break;
    case 6:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xfff7ffff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0x13;
      break;
    case 7:
      *(uint *)((long)task_local + 0xf4) =
           *(uint *)((long)task_local + 0xf4) & 0xf7ffffff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0x1b;
      break;
    case 8:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffffff7 |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 3;
      break;
    case 9:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfffff7ff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0xb;
      break;
    case 10:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xfff7ffff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0x13;
      break;
    case 0xb:
      *(uint *)((long)task_local + 0xf8) =
           *(uint *)((long)task_local + 0xf8) & 0xf7ffffff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0x1b;
      break;
    case 0xc:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffffff7 |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 3;
      break;
    case 0xd:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfffff7ff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0xb;
      break;
    case 0xe:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xfff7ffff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0x13;
      break;
    case 0xf:
      *(uint *)((long)task_local + 0xfc) =
           *(uint *)((long)task_local + 0xfc) & 0xf7ffffff |
           ((int)(uint)*(ushort *)&common[0x18].reg019.field_0x2 >> (bVar5 & 0x1f) & 1U) << 0x1b;
    }
    if ((&(common->reg012).field_0x0)[near_index] == -1) {
      if ((int)(uint)mbuffer_1 < 0) {
        local_cc = (uint)(*(byte *)&common->reg009 & 0x7f);
      }
      else {
        local_cc = (uint)mbuffer_1;
      }
      mbuffer_1._4_4_ = local_cc;
    }
    else {
      mbuffer_1._4_4_ = (uint)((&(common->reg012).field_0x0)[near_index] & 0x7f);
      mbuffer_1._0_4_ = (uint)((&(common->reg012).field_0x0)[near_index] & 0x7f);
    }
    if ((*(ushort *)&(common->reg009).field_0x2 & 1) == 0) {
      if (mbuffer_1._4_4_ == (*(byte *)&common->reg009 & 0x7f)) {
        switch(near_index * 2) {
        case 0:
          *(uint *)((long)task_local + 0x1fc) = *(uint *)((long)task_local + 0x1fc) & 0xfffffff0 | 3
          ;
          break;
        case 2:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xfffff0ff | 0x300;
          break;
        case 4:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xfff0ffff | 0x30000;
          break;
        case 6:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xf0ffffff | 0x3000000;
          break;
        case 8:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xfffffff0 | 3;
          break;
        case 10:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xfffff0ff | 0x300;
          break;
        case 0xc:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xfff0ffff | 0x30000;
          break;
        case 0xe:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xf0ffffff | 0x3000000;
          break;
        case 0x10:
          *(uint *)((long)task_local + 0x204) = *(uint *)((long)task_local + 0x204) & 0xfffffff0 | 3
          ;
          break;
        case 0x12:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xfffff0ff | 0x300;
          break;
        case 0x14:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xfff0ffff | 0x30000;
          break;
        case 0x16:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xf0ffffff | 0x3000000;
          break;
        case 0x18:
          *(uint *)((long)task_local + 0x208) = *(uint *)((long)task_local + 0x208) & 0xfffffff0 | 3
          ;
          break;
        case 0x1a:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xfffff0ff | 0x300;
          break;
        case 0x1c:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xfff0ffff | 0x30000;
          break;
        case 0x1e:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xf0ffffff | 0x3000000;
        }
        switch(near_index * 2) {
        case 0:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xffffff0f | 0x30;
          break;
        case 1:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xfffff0ff | 0x300;
          break;
        case 2:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xffff0fff | 0x3000;
          break;
        case 3:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xfff0ffff | 0x30000;
          break;
        case 4:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xff0fffff | 0x300000;
          break;
        case 5:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xf0ffffff | 0x3000000;
          break;
        case 6:
          *(uint *)((long)task_local + 0x1fc) =
               *(uint *)((long)task_local + 0x1fc) & 0xfffffff | 0x30000000;
          break;
        case 7:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xfffffff0 | 3;
          break;
        case 8:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xffffff0f | 0x30;
          break;
        case 9:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xfffff0ff | 0x300;
          break;
        case 10:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xffff0fff | 0x3000;
          break;
        case 0xb:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xfff0ffff | 0x30000;
          break;
        case 0xc:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xff0fffff | 0x300000;
          break;
        case 0xd:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xf0ffffff | 0x3000000;
          break;
        case 0xe:
          task_local[4].dec.valid = task_local[4].dec.valid & 0xfffffff | 0x30000000;
          break;
        case 0xf:
          *(uint *)((long)task_local + 0x204) = *(uint *)((long)task_local + 0x204) & 0xfffffff0 | 3
          ;
          break;
        case 0x10:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xffffff0f | 0x30;
          break;
        case 0x11:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xfffff0ff | 0x300;
          break;
        case 0x12:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xffff0fff | 0x3000;
          break;
        case 0x13:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xfff0ffff | 0x30000;
          break;
        case 0x14:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xff0fffff | 0x300000;
          break;
        case 0x15:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xf0ffffff | 0x3000000;
          break;
        case 0x16:
          *(uint *)((long)task_local + 0x204) =
               *(uint *)((long)task_local + 0x204) & 0xfffffff | 0x30000000;
          break;
        case 0x17:
          *(uint *)((long)task_local + 0x208) = *(uint *)((long)task_local + 0x208) & 0xfffffff0 | 3
          ;
          break;
        case 0x18:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xffffff0f | 0x30;
          break;
        case 0x19:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xfffff0ff | 0x300;
          break;
        case 0x1a:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xffff0fff | 0x3000;
          break;
        case 0x1b:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xfff0ffff | 0x30000;
          break;
        case 0x1c:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xff0fffff | 0x300000;
          break;
        case 0x1d:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xf0ffffff | 0x3000000;
          break;
        case 0x1e:
          *(uint *)((long)task_local + 0x208) =
               *(uint *)((long)task_local + 0x208) & 0xfffffff | 0x30000000;
          break;
        case -1:
          *(uint *)((long)task_local + 0x1fc) = *(uint *)((long)task_local + 0x1fc) & 0xfffffff0 | 3
          ;
        }
      }
    }
    else {
      switch(near_index * 2) {
      case 0:
        *(uint *)((long)task_local + 0x1fc) = *(uint *)((long)task_local + 0x1fc) & 0xfffffff0;
        break;
      case 2:
        *(uint *)((long)task_local + 0x1fc) = *(uint *)((long)task_local + 0x1fc) & 0xfffff0ff;
        break;
      case 4:
        *(uint *)((long)task_local + 0x1fc) = *(uint *)((long)task_local + 0x1fc) & 0xfff0ffff;
        break;
      case 6:
        *(uint *)((long)task_local + 0x1fc) = *(uint *)((long)task_local + 0x1fc) & 0xf0ffffff;
        break;
      case 8:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xfffffff0;
        break;
      case 10:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xfffff0ff;
        break;
      case 0xc:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xfff0ffff;
        break;
      case 0xe:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xf0ffffff;
        break;
      case 0x10:
        *(uint *)((long)task_local + 0x204) = *(uint *)((long)task_local + 0x204) & 0xfffffff0;
        break;
      case 0x12:
        *(uint *)((long)task_local + 0x204) = *(uint *)((long)task_local + 0x204) & 0xfffff0ff;
        break;
      case 0x14:
        *(uint *)((long)task_local + 0x204) = *(uint *)((long)task_local + 0x204) & 0xfff0ffff;
        break;
      case 0x16:
        *(uint *)((long)task_local + 0x204) = *(uint *)((long)task_local + 0x204) & 0xf0ffffff;
        break;
      case 0x18:
        *(uint *)((long)task_local + 0x208) = *(uint *)((long)task_local + 0x208) & 0xfffffff0;
        break;
      case 0x1a:
        *(uint *)((long)task_local + 0x208) = *(uint *)((long)task_local + 0x208) & 0xfffff0ff;
        break;
      case 0x1c:
        *(uint *)((long)task_local + 0x208) = *(uint *)((long)task_local + 0x208) & 0xfff0ffff;
        break;
      case 0x1e:
        *(uint *)((long)task_local + 0x208) = *(uint *)((long)task_local + 0x208) & 0xf0ffffff;
      }
      switch(near_index * 2) {
      case 0:
        *(uint *)((long)task_local + 0x1fc) =
             *(uint *)((long)task_local + 0x1fc) & 0xffffff0f | 0x10;
        break;
      case 1:
        *(uint *)((long)task_local + 0x1fc) =
             *(uint *)((long)task_local + 0x1fc) & 0xfffff0ff | 0x100;
        break;
      case 2:
        *(uint *)((long)task_local + 0x1fc) =
             *(uint *)((long)task_local + 0x1fc) & 0xffff0fff | 0x1000;
        break;
      case 3:
        *(uint *)((long)task_local + 0x1fc) =
             *(uint *)((long)task_local + 0x1fc) & 0xfff0ffff | 0x10000;
        break;
      case 4:
        *(uint *)((long)task_local + 0x1fc) =
             *(uint *)((long)task_local + 0x1fc) & 0xff0fffff | 0x100000;
        break;
      case 5:
        *(uint *)((long)task_local + 0x1fc) =
             *(uint *)((long)task_local + 0x1fc) & 0xf0ffffff | 0x1000000;
        break;
      case 6:
        *(uint *)((long)task_local + 0x1fc) =
             *(uint *)((long)task_local + 0x1fc) & 0xfffffff | 0x10000000;
        break;
      case 7:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xfffffff0 | 1;
        break;
      case 8:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xffffff0f | 0x10;
        break;
      case 9:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xfffff0ff | 0x100;
        break;
      case 10:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xffff0fff | 0x1000;
        break;
      case 0xb:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xfff0ffff | 0x10000;
        break;
      case 0xc:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xff0fffff | 0x100000;
        break;
      case 0xd:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xf0ffffff | 0x1000000;
        break;
      case 0xe:
        task_local[4].dec.valid = task_local[4].dec.valid & 0xfffffff | 0x10000000;
        break;
      case 0xf:
        *(uint *)((long)task_local + 0x204) = *(uint *)((long)task_local + 0x204) & 0xfffffff0 | 1;
        break;
      case 0x10:
        *(uint *)((long)task_local + 0x204) =
             *(uint *)((long)task_local + 0x204) & 0xffffff0f | 0x10;
        break;
      case 0x11:
        *(uint *)((long)task_local + 0x204) =
             *(uint *)((long)task_local + 0x204) & 0xfffff0ff | 0x100;
        break;
      case 0x12:
        *(uint *)((long)task_local + 0x204) =
             *(uint *)((long)task_local + 0x204) & 0xffff0fff | 0x1000;
        break;
      case 0x13:
        *(uint *)((long)task_local + 0x204) =
             *(uint *)((long)task_local + 0x204) & 0xfff0ffff | 0x10000;
        break;
      case 0x14:
        *(uint *)((long)task_local + 0x204) =
             *(uint *)((long)task_local + 0x204) & 0xff0fffff | 0x100000;
        break;
      case 0x15:
        *(uint *)((long)task_local + 0x204) =
             *(uint *)((long)task_local + 0x204) & 0xf0ffffff | 0x1000000;
        break;
      case 0x16:
        *(uint *)((long)task_local + 0x204) =
             *(uint *)((long)task_local + 0x204) & 0xfffffff | 0x10000000;
        break;
      case 0x17:
        *(uint *)((long)task_local + 0x208) = *(uint *)((long)task_local + 0x208) & 0xfffffff0 | 1;
        break;
      case 0x18:
        *(uint *)((long)task_local + 0x208) =
             *(uint *)((long)task_local + 0x208) & 0xffffff0f | 0x10;
        break;
      case 0x19:
        *(uint *)((long)task_local + 0x208) =
             *(uint *)((long)task_local + 0x208) & 0xfffff0ff | 0x100;
        break;
      case 0x1a:
        *(uint *)((long)task_local + 0x208) =
             *(uint *)((long)task_local + 0x208) & 0xffff0fff | 0x1000;
        break;
      case 0x1b:
        *(uint *)((long)task_local + 0x208) =
             *(uint *)((long)task_local + 0x208) & 0xfff0ffff | 0x10000;
        break;
      case 0x1c:
        *(uint *)((long)task_local + 0x208) =
             *(uint *)((long)task_local + 0x208) & 0xff0fffff | 0x100000;
        break;
      case 0x1d:
        *(uint *)((long)task_local + 0x208) =
             *(uint *)((long)task_local + 0x208) & 0xf0ffffff | 0x1000000;
        break;
      case 0x1e:
        *(uint *)((long)task_local + 0x208) =
             *(uint *)((long)task_local + 0x208) & 0xfffffff | 0x10000000;
        break;
      case -1:
        *(uint *)((long)task_local + 0x1fc) = *(uint *)((long)task_local + 0x1fc) & 0xfffffff0 | 1;
      }
    }
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)&(regs_local->common).reg028,mbuffer_1._4_4_,SLOT_BUFFER,
               &stack0xffffffffffffff88);
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)&(regs_local->common).reg028,mbuffer_1._4_4_,SLOT_FRAME_PTR,&top_used
              );
    if (((*(ushort *)(&common[1].reg027.field_0x0 + (long)near_index * 2) <
          *(ushort *)&common[2].reg019.field_0x2) &&
        (mframe_1._4_4_ < *(ushort *)(&common[1].reg027.field_0x0 + (long)near_index * 2))) &&
       (RVar4 = mpp_frame_get_errinfo(_top_used), RVar4 == 0)) {
      mframe_1._4_4_ = (uint)*(ushort *)(&common[1].reg027.field_0x0 + (long)near_index * 2);
      iVar3 = mpp_buffer_get_fd_with_caller(pvStack_78,"set_registers");
      *(int *)((long)task_local + 0x138) = iVar3;
      if ((*(ushort *)&(common->reg009).field_0x2 >> 8 & 1) == 0) {
        *(uint *)&mv_buf[3].field_0x4 = *(uint *)&mv_buf[3].field_0x4 & 0xfffffffd;
      }
    }
    iVar3 = mpp_buffer_get_fd_with_caller(pvStack_78,"set_registers");
    *(int *)((long)task_local + (long)near_index * 4 + 0x174) = iVar3;
    mframe = hal_bufs_get_buf(*(HalBufs *)(regs_local->h264d_param).reg67_98_ref_poc,mbuffer_1._4_4_
                             );
    iVar3 = mpp_buffer_get_fd_with_caller(*((HalBuf *)mframe)->buf,"set_registers");
    *(int *)((long)task_local + (long)near_index * 4 + 0x1b8) = iVar3;
  }
  reg_ctx = (Vdpu34xH264dRegCtx *)0x0;
  lVar1 = *(long *)((regs_local->h264d_param).reg67_98_ref_poc + 8);
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)&(regs_local->common).reg030,pp->FieldOrderCntList[0][1],SLOT_BUFFER,
             &reg_ctx);
  iVar3 = mpp_buffer_get_fd_with_caller(reg_ctx,"set_registers");
  *(int *)((long)task_local + 0x128) = iVar3;
  *(undefined4 *)((long)task_local + 300) = *(undefined4 *)((long)task_local + 0x128);
  *(undefined4 *)((long)task_local + 0x1f8) = *(undefined4 *)(lVar1 + 0x318);
  mpp_dev_set_reg_offset
            (*(MppDev *)((regs_local->h264d_param).reg67_98_ref_poc + 6),0xc5,
             *(RK_U32 *)(lVar1 + 0x328));
  return MPP_OK;
}

Assistant:

static MPP_RET set_registers(H264dHalCtx_t *p_hal, Vdpu34xH264dRegSet *regs, HalTaskInfo *task)
{
    DXVA_PicParams_H264_MVC *pp = p_hal->pp;
    Vdpu34xRegCommon *common = &regs->common;
    HalBuf *mv_buf = NULL;

    // memset(regs, 0, sizeof(Vdpu34xH264dRegSet));
    memset(&regs->h264d_highpoc, 0, sizeof(regs->h264d_highpoc));
    common->reg016_str_len = p_hal->strm_len;
    common->reg013.cur_pic_is_idr = p_hal->slice_long->idr_flag;
    common->reg012.colmv_compress_en = (pp->frame_mbs_only_flag) ? 1 : 0;
    common->reg028.sw_poc_arb_flag = 0;

    /* caculate the yuv_frame_size */
    {
        MppFrame mframe = NULL;
        RK_U32 hor_virstride = 0;
        RK_U32 ver_virstride = 0;
        RK_U32 y_virstride = 0;

        mpp_buf_slot_get_prop(p_hal->frame_slots, pp->CurrPic.Index7Bits, SLOT_FRAME_PTR, &mframe);
        hor_virstride = mpp_frame_get_hor_stride(mframe);
        ver_virstride = mpp_frame_get_ver_stride(mframe);
        y_virstride = hor_virstride * ver_virstride;

        if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
            RK_U32 fbc_hdr_stride = mpp_frame_get_fbc_hdr_stride(mframe);
            RK_U32 fbd_offset = MPP_ALIGN(fbc_hdr_stride * (ver_virstride + 16) / 16, SZ_4K);

            common->reg012.fbc_e = 1;
            common->reg018.y_hor_virstride = fbc_hdr_stride / 16;
            common->reg019.uv_hor_virstride = fbc_hdr_stride / 16;
            common->reg020_fbc_payload_off.payload_st_offset = fbd_offset >> 4;
        } else {
            common->reg012.fbc_e = 0;
            common->reg018.y_hor_virstride = hor_virstride / 16;
            common->reg019.uv_hor_virstride = hor_virstride / 16;
            common->reg020_y_virstride.y_virstride = y_virstride / 16;
        }
    }
    /* set current frame info */
    {
        MppBuffer mbuffer = NULL;
        RK_S32 fd = -1;

        regs->h264d_param.reg65.cur_top_poc = pp->CurrFieldOrderCnt[0];
        regs->h264d_param.reg66.cur_bot_poc = pp->CurrFieldOrderCnt[1];
        mpp_buf_slot_get_prop(p_hal->frame_slots, pp->CurrPic.Index7Bits, SLOT_BUFFER, &mbuffer);
        fd = mpp_buffer_get_fd(mbuffer);
        regs->common_addr.reg130_decout_base = fd;

        //colmv_cur_base
        mv_buf = hal_bufs_get_buf(p_hal->cmv_bufs, pp->CurrPic.Index7Bits);
        regs->common_addr.reg131_colmv_cur_base = mpp_buffer_get_fd(mv_buf->buf[0]);
        regs->common_addr.reg132_error_ref_base = fd;
        /*
         * poc_hight bit[0] :
         *  0 -> top field or frame
         *  1 -> bot field
         */
        if (pp->field_pic_flag)
            regs->h264d_highpoc.reg204.cur_poc_highbit = pp->CurrPic.AssociatedFlag;
        else
            regs->h264d_highpoc.reg204.cur_poc_highbit = 0;
    }
    /* set reference info */
    {
        RK_S32 i = 0;
        RK_S32 ref_index = -1;
        RK_S32 near_index = -1;
        MppBuffer mbuffer = NULL;
        RK_U32 min_frame_num  = 0;
        MppFrame mframe = NULL;

        for (i = 0; i <= 15; i++) {
            RK_U32 field_flag = (pp->RefPicFiledFlags >> i) & 0x01;
            RK_U32 top_used = (pp->UsedForReferenceFlags >> (2 * i + 0)) & 0x01;
            RK_U32 bot_used = (pp->UsedForReferenceFlags >> (2 * i + 1)) & 0x01;

            regs->h264d_param.reg67_98_ref_poc[2 * i] = pp->FieldOrderCntList[i][0];
            regs->h264d_param.reg67_98_ref_poc[2 * i + 1] = pp->FieldOrderCntList[i][1];
            SET_REF_INFO(regs->h264d_param, i, field, field_flag);
            SET_REF_INFO(regs->h264d_param, i, topfield_used, top_used);
            SET_REF_INFO(regs->h264d_param, i, botfield_used, bot_used);
            SET_REF_INFO(regs->h264d_param, i, colmv_use_flag, (pp->RefPicColmvUsedFlags >> i) & 0x01);

            if (pp->RefFrameList[i].bPicEntry != 0xff) {
                ref_index = pp->RefFrameList[i].Index7Bits;
                near_index = pp->RefFrameList[i].Index7Bits;
            } else {
                ref_index = (near_index < 0) ? pp->CurrPic.Index7Bits : near_index;
            }

            if (pp->field_pic_flag) {
                SET_POC_HIGNBIT_INFO(regs->h264d_highpoc, 2 * i, poc_highbit, 0);
                SET_POC_HIGNBIT_INFO(regs->h264d_highpoc, 2 * i + 1, poc_highbit, 1);
            } else if (ref_index == pp->CurrPic.Index7Bits) {
                SET_POC_HIGNBIT_INFO(regs->h264d_highpoc, 2 * i, poc_highbit, 3);
                SET_POC_HIGNBIT_INFO(regs->h264d_highpoc, 2 * i + 1, poc_highbit, 3);
            }

            mpp_buf_slot_get_prop(p_hal->frame_slots, ref_index, SLOT_BUFFER, &mbuffer);
            mpp_buf_slot_get_prop(p_hal->frame_slots, ref_index, SLOT_FRAME_PTR, &mframe);

            if (pp->FrameNumList[i] < pp->frame_num &&
                pp->FrameNumList[i] > min_frame_num &&
                (!mpp_frame_get_errinfo(mframe))) {
                min_frame_num = pp->FrameNumList[i];
                regs->common_addr.reg132_error_ref_base =  mpp_buffer_get_fd(mbuffer);
                if (!pp->weighted_pred_flag)
                    common->reg021.error_intra_mode = 0;
            }

            regs->h264d_addr.ref_base[i] = mpp_buffer_get_fd(mbuffer);
            mv_buf = hal_bufs_get_buf(p_hal->cmv_bufs, ref_index);
            regs->h264d_addr.colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
        }
    }
    /* set input */
    {
        MppBuffer mbuffer = NULL;
        Vdpu34xH264dRegCtx *reg_ctx = (Vdpu34xH264dRegCtx *)p_hal->reg_ctx;

        mpp_buf_slot_get_prop(p_hal->packet_slots, task->dec.input, SLOT_BUFFER, &mbuffer);
        regs->common_addr.reg128_rlc_base = mpp_buffer_get_fd(mbuffer);
        regs->common_addr.reg129_rlcwrite_base = regs->common_addr.reg128_rlc_base;

        regs->h264d_addr.cabactbl_base = reg_ctx->bufs_fd;
        mpp_dev_set_reg_offset(p_hal->dev, 197, reg_ctx->offset_cabac);
    }

    return MPP_OK;
}